

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

int mbedtls_timing_get_delay(void *data)

{
  uint uVar1;
  ulong uVar2;
  _hr_time *t;
  mbedtls_timing_delay_context *ctx;
  timeval now;
  timeval local_20;
  
  if (*(int *)((long)data + 0x24) != 0) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    uVar2 = (local_20.tv_usec - *(long *)((long)data + 8)) / 1000 + (local_20.tv_sec - *data) * 1000
    ;
    uVar1 = 2;
    if (uVar2 < *(uint *)((long)data + 0x24)) {
      uVar1 = (uint)(*(uint *)((long)data + 0x20) <= uVar2);
    }
    return uVar1;
  }
  return -1;
}

Assistant:

int mbedtls_timing_get_delay( void *data )
{
    mbedtls_timing_delay_context *ctx = (mbedtls_timing_delay_context *) data;
    unsigned long elapsed_ms;

    if( ctx->fin_ms == 0 )
        return( -1 );

    elapsed_ms = mbedtls_timing_get_timer( &ctx->timer, 0 );

    if( elapsed_ms >= ctx->fin_ms )
        return( 2 );

    if( elapsed_ms >= ctx->int_ms )
        return( 1 );

    return( 0 );
}